

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_mq.c
# Opt level: O1

void skynet_mq_push(message_queue *q,skynet_message *message)

{
  skynet_message *psVar1;
  undefined8 *puVar2;
  uint uVar3;
  skynet_message *psVar4;
  void *pvVar5;
  int iVar6;
  skynet_message *psVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  if (message == (skynet_message *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_mq.c"
                  ,0xbf,"void skynet_mq_push(struct message_queue *, struct skynet_message *)");
  }
  do {
    LOCK();
    iVar9 = (q->lock).lock;
    (q->lock).lock = 1;
    UNLOCK();
  } while (iVar9 != 0);
  psVar7 = q->queue;
  iVar9 = q->tail;
  psVar7[iVar9].sz = message->sz;
  iVar8 = message->session;
  pvVar5 = message->data;
  psVar7 = psVar7 + iVar9;
  psVar7->source = message->source;
  psVar7->session = iVar8;
  psVar7->data = pvVar5;
  iVar6 = q->tail + 1;
  uVar3 = q->cap;
  iVar9 = q->head;
  iVar8 = 0;
  if (iVar6 < (int)uVar3) {
    iVar8 = iVar6;
  }
  q->tail = iVar8;
  if (iVar9 == iVar8) {
    psVar7 = (skynet_message *)malloc((long)(int)uVar3 * 0x30);
    if (0 < (int)uVar3) {
      psVar4 = q->queue;
      lVar10 = 0;
      do {
        *(size_t *)((long)&psVar7->sz + lVar10) = psVar4[iVar9 % (int)uVar3].sz;
        psVar1 = psVar4 + iVar9 % (int)uVar3;
        pvVar5 = psVar1->data;
        puVar2 = (undefined8 *)((long)&psVar7->source + lVar10);
        *puVar2 = *(undefined8 *)psVar1;
        puVar2[1] = pvVar5;
        lVar10 = lVar10 + 0x18;
        iVar9 = iVar9 + 1;
      } while ((ulong)uVar3 * 0x18 != lVar10);
    }
    q->head = 0;
    q->tail = uVar3;
    q->cap = uVar3 * 2;
    free(q->queue);
    q->queue = psVar7;
  }
  if (q->in_global == 0) {
    q->in_global = 1;
    skynet_globalmq_push(q);
  }
  (q->lock).lock = 0;
  return;
}

Assistant:

void 
skynet_mq_push(struct message_queue *q, struct skynet_message *message) {
	assert(message);
	SPIN_LOCK(q)

	q->queue[q->tail] = *message;
	if (++ q->tail >= q->cap) {
		q->tail = 0;
	}

	if (q->head == q->tail) {
		expand_queue(q);
	}

	if (q->in_global == 0) {
		q->in_global = MQ_IN_GLOBAL;
		skynet_globalmq_push(q);
	}
	
	SPIN_UNLOCK(q)
}